

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  double *pdVar2;
  Scalar SVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  MatrixXd y;
  MatrixXd se;
  MatrixXd X;
  vector<double,_std::allocator<double>_> labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  dataset;
  ANN n;
  allocator_type local_22c;
  allocator_type local_22b;
  allocator_type local_22a;
  allocator_type local_229;
  DenseStorage<double,__1,__1,__1,_0> local_228;
  XprType local_208;
  DenseStorage<double,__1,__1,__1,_0> local_1e8;
  MatrixXd local_1d0;
  vector<double,_std::allocator<double>_> local_1b8;
  long lStack_1a0;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_198;
  vector<double,_std::allocator<double>_> vStack_180;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_a0;
  DenseStorage<double,__1,__1,__1,_0> local_88;
  ANN local_70;
  
  ANN::ANN(&local_70);
  ANN::setLearningRate(&local_70,0.1);
  ANN::setInputSize(&local_70,2);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"tanh","");
  ANN::addLayer(&local_70,3,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"tanh","");
  ANN::addLayer(&local_70,3,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"tanh","");
  ANN::addLayer(&local_70,1,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_1b8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_198,__l,(allocator_type *)&local_1d0)
  ;
  local_1e8.m_data = (double *)0x0;
  local_1e8.m_rows = 0x3ff0000000000000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1e8;
  std::vector<double,_std::allocator<double>_>::vector(&vStack_180,__l_00,&local_229);
  local_228.m_data = (double *)0x3ff0000000000000;
  local_228.m_rows = 0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_228;
  std::vector<double,_std::allocator<double>_>::vector(&local_168,__l_01,&local_22a);
  local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (Scalar *)0x3ff0000000000000;
  local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_208;
  std::vector<double,_std::allocator<double>_>::vector(&local_150,__l_02,&local_22b);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_198;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_d0,__l_03,&local_22c);
  lVar5 = 0x60;
  do {
    pvVar1 = *(void **)((long)&local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_finish + lVar5);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&lStack_1a0 + lVar5) - (long)pvVar1);
    }
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != 0);
  local_198.m_xpr = (XprType *)0x3ff0000000000000;
  vStack_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  local_198.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)0xbff0000000000000;
  local_198.m_evaluator.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_outerStride.
  m_value = 0x3ff0000000000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)&local_198;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1b8,__l_04,(allocator_type *)&local_1e8);
  local_1e8.m_data = (double *)0x0;
  local_1e8.m_rows = 0;
  local_1e8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1e8,8,4,2);
  local_228.m_data = (double *)0x0;
  local_228.m_rows = 0;
  local_228.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_228,4,4,1);
  lVar5 = 0;
  while ((lVar5 < local_1e8.m_rows && (0 < local_1e8.m_cols))) {
    pdVar2 = ((local_d0.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    local_1e8.m_data[lVar5] = *pdVar2;
    if ((local_1e8.m_cols == 1) ||
       ((local_1e8.m_data[local_1e8.m_rows + lVar5] = pdVar2[1], local_228.m_rows <= lVar5 ||
        (local_228.m_cols < 1)))) break;
    local_228.m_data[lVar5] =
         local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[lVar5];
    lVar5 = lVar5 + 1;
    local_d0.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_d0.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    if (lVar5 == 4) {
      uVar7 = 0;
      do {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_88,&local_1e8);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_a0,&local_228);
        ANN::fit(&local_70,(MatrixXd *)&local_88,(MatrixXd *)&local_a0);
        iVar6 = (int)uVar7;
        free(local_a0.m_data);
        free(local_88.m_data);
        if ((int)(uVar7 / 10) * 10 == iVar6) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_b8,&local_1e8);
          ANN::predict(&local_1d0,&local_70,(MatrixXd *)&local_b8);
          if ((local_228.m_rows !=
               local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows) ||
             (local_228.m_cols !=
              local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols)) {
            __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                          ,0x6e,
                          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                         );
          }
          if ((local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols | local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows) < 0) {
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,
                          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Array<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Array<double, -1, -1>]"
                         );
          }
          local_198.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
          m_outerStride.m_value = (long)&local_228;
          local_198.m_xpr = &local_1d0;
          vStack_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows;
          vStack_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols;
          local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_208,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                      *)&local_198);
          free(local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_b8.m_data);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Epoch: ",7);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," MSE: ",6);
          if ((local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows < 1) ||
             (local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 1)) {
            __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                          ,0x19d,
                          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, -1>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                         );
          }
          local_198.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data
               = local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
          local_198.m_evaluator.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
          m_outerStride.m_value =
               local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_198.m_xpr = &local_208;
          SVar3 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
                  ::run(&local_198,(scalar_sum_op<double,_double> *)&local_1d0);
          poVar4 = std::ostream::_M_insert<double>
                             (SVar3 / (double)(local_208.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                               .m_storage.m_cols *
                                              local_208.
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                              .m_storage.m_rows));
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          free(local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
        }
        uVar7 = (ulong)(iVar6 + 1U);
        if (iVar6 + 1U == 1000) {
          free(local_228.m_data);
          free(local_1e8.m_data);
          if (local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::~vector(&local_d0);
          ANN::~ANN(&local_70);
          return 0;
        }
      } while( true );
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x16d,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
               );
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setLearningRate(0.1);
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    vector<vector<double>> dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> labels = {-1, 1, 1, -1};
    
    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = dataset[j][0];
        X(j,1) = dataset[j][1];
        y(j,0) = labels[j];
    }
    
    for(int i = 0; i < 1000; i++) {
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << "Epoch: " << i << " MSE: " << se.mean() << endl;
        }
    }
    return 0;
}